

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Cell __thiscall cppforth::Forth::getDataCell(Forth *this,CAddr pointer)

{
  Cell CVar1;
  CAddr pointer_local;
  Forth *this_local;
  
  CVar1 = dataSpaceAtCell(this,pointer);
  return CVar1;
}

Assistant:

Cell getDataCell(CAddr pointer){
			return dataSpaceAtCell(pointer);
			/* Cell tmp{ 0 }, tmpRes{ 0 };
			for (size_t i = 0; i < sizeof(Cell); ++i){
				tmp=dataSpaceAt(pointer + i) ;
				tmp <<= 8*i;
				tmpRes |= tmp;
			}
			return tmpRes;
			*/
		}